

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O3

void __thiscall
CLineInput::DrawSelection(CLineInput *this,float HeightWeight,int Start,int End,vec4 Color)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar4;
  CTextBoundingBox CVar5;
  CQuadItem aSelectionQuads [3];
  float local_a0;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_98;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_94;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_88;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_84;
  undefined1 local_58 [4];
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (this->m_TextCursor).m_Align & 0xc;
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,Start);
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,(ulong)(uint)End);
  fVar4 = (this->m_TextCursor).m_NextLineAdvanceY / (float)(this->m_TextCursor).m_LineCount;
  if (uVar3 == 4) {
    local_a0 = fVar4 * 0.5;
  }
  else {
    if (uVar3 != 0) {
      local_a0 = (HeightWeight + 0.35000002) * fVar4 + -1.0;
      goto LAB_001864ff;
    }
    local_a0 = -1.0;
  }
  local_a0 = local_a0 - (1.0 - HeightWeight) * fVar4;
LAB_001864ff:
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_98 = Color.field_0;
  aStack_94 = Color.field_1;
  local_88 = Color.field_2;
  aStack_84 = Color.field_3;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (local_98.x,aStack_94.y,local_88.z,aStack_84.w);
  if (extraout_XMM0_Db_00 <= extraout_XMM0_Db) {
    pp_Var1 = (s_pGraphics->super_IInterface)._vptr_IInterface;
    uVar2 = 1;
    local_50 = extraout_XMM0_Da_00;
  }
  else {
    CVar5 = CTextCursor::AlignedBoundingBox(&this->m_TextCursor);
    local_40 = CVar5.w;
    local_48 = CVar5.x + (this->m_TextCursor).m_CursorPos.field_0.x;
    local_50 = local_40 + local_48;
    local_44 = (extraout_XMM0_Db - local_a0) + fVar4;
    if (extraout_XMM0_Db_00 - extraout_XMM0_Db <= fVar4) {
      local_40 = extraout_XMM0_Da_00 - local_48;
      uVar2 = 2;
      local_3c = HeightWeight * fVar4;
    }
    else {
      local_3c = (extraout_XMM0_Db_00 - extraout_XMM0_Db) - fVar4;
      local_34 = local_3c + local_44;
      local_30 = extraout_XMM0_Da_00 - local_48;
      uVar2 = 3;
      local_38 = local_48;
      local_2c = HeightWeight * fVar4;
    }
    pp_Var1 = (s_pGraphics->super_IInterface)._vptr_IInterface;
  }
  local_4c = HeightWeight * fVar4;
  local_50 = local_50 - extraout_XMM0_Da;
  local_54 = extraout_XMM0_Db - local_a0;
  (*pp_Var1[0x1d])(s_pGraphics,local_58,uVar2);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLineInput::DrawSelection(float HeightWeight, int Start, int End, vec4 Color)
{
	const int VAlign = m_TextCursor.m_Align&TEXTALIGN_MASK_VERT;

	const vec2 StartPos = s_pTextRender->CaretPosition(&m_TextCursor, Start);
	const vec2 EndPos = s_pTextRender->CaretPosition(&m_TextCursor, End);
	const float LineHeight = m_TextCursor.BaseLineY()/m_TextCursor.LineCount();
	const float VAlignOffset =
		(VAlign == TEXTALIGN_TOP) ? -LineHeight*(1.0f-HeightWeight)-1.0f :
		(VAlign == TEXTALIGN_MIDDLE) ? -LineHeight*(1.0f-HeightWeight)+LineHeight/2 :
		/* TEXTALIGN_BOTTOM */ LineHeight*(1.35f-1.0f+HeightWeight)-1.0f;
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color);
	if(StartPos.y < EndPos.y) // multi line selection
	{
		CTextBoundingBox BoundingBox = m_TextCursor.BoundingBox();
		int NumQuads = 0;
		IGraphics::CQuadItem aSelectionQuads[3];
		aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(StartPos.x, StartPos.y - VAlignOffset, BoundingBox.Right() - StartPos.x, LineHeight*HeightWeight);
		const float SecondSegmentY = StartPos.y - VAlignOffset + LineHeight;
		if(EndPos.y - StartPos.y > LineHeight)
		{
			const float MiddleSegmentHeight = EndPos.y - StartPos.y - LineHeight;
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, BoundingBox.w, MiddleSegmentHeight);
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY + MiddleSegmentHeight, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		}
		else
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(aSelectionQuads, NumQuads);
	}
	else // single line selection
	{
		IGraphics::CQuadItem SelectionQuad(StartPos.x, StartPos.y - VAlignOffset, EndPos.x - StartPos.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(&SelectionQuad, 1);
	}
	s_pGraphics->QuadsEnd();
}